

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_version_number.cpp
# Opt level: O1

ON_String ON_SdkVersionNumberToString(uint sdk_version_number,uint sdk_service_release_number)

{
  bool bVar1;
  bool bVar2;
  uint in_EDX;
  undefined4 in_register_0000003c;
  ON_String *this;
  ON_String local_30;
  
  this = (ON_String *)CONCAT44(in_register_0000003c,sdk_version_number);
  bVar1 = ON_VersionNumberIsValid(sdk_service_release_number);
  bVar2 = ON_VersionNumberIsValid(in_EDX);
  ON_VersionNumberToString(sdk_version_number,SUB41(sdk_service_release_number,0),true);
  ON_String::operator+=(this,".");
  ON_VersionNumberToString((uint)&local_30,SUB41(in_EDX,0),true);
  ON_String::operator+=(this,&local_30);
  ON_String::~ON_String(&local_30);
  if (bVar1 || bVar2) {
    ON_String::operator+=(this," (");
    if (sdk_service_release_number == in_EDX || bVar2 != bVar1) {
      if (bVar1) {
        in_EDX = sdk_service_release_number;
      }
      ON_VersionNumberToString((uint)&local_30,SUB41(in_EDX,0),false);
      ON_String::operator+=(this,&local_30);
    }
    else {
      ON_VersionNumberToString((uint)&local_30,SUB41(sdk_service_release_number,0),false);
      ON_String::operator+=(this,&local_30);
      ON_String::~ON_String(&local_30);
      ON_String::operator+=(this,", ");
      ON_VersionNumberToString((uint)&local_30,SUB41(in_EDX,0),false);
      ON_String::operator+=(this,&local_30);
    }
    ON_String::~ON_String(&local_30);
    ON_String::operator+=(this,")");
  }
  return (ON_String)(char *)this;
}

Assistant:

const ON_String ON_SdkVersionNumberToString(
  unsigned int sdk_version_number,
  unsigned int sdk_service_release_number
)
{
  const bool bValidVersionNumber = ON_VersionNumberIsValid(sdk_version_number);
  const bool bValidServiceReleaseNumber = ON_VersionNumberIsValid(sdk_service_release_number);
  ON_String str_version = ON_VersionNumberToString(sdk_version_number, true, false);
  str_version += ".";
  str_version += ON_VersionNumberToString(sdk_service_release_number, true, false);
  if (bValidVersionNumber || bValidServiceReleaseNumber)
  {
    str_version += " (";
    if (bValidVersionNumber != bValidServiceReleaseNumber || sdk_version_number == sdk_service_release_number )
    {
      str_version += ON_VersionNumberToString(bValidVersionNumber ? sdk_version_number : sdk_service_release_number, false, true);
    }
    else
    {
      str_version += ON_VersionNumberToString(sdk_version_number, false, true);
      str_version += ", ";
      str_version += ON_VersionNumberToString(sdk_service_release_number, false, true);
    }
    str_version += ")";
  }
  return str_version;
}